

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecognitionException.hpp
# Opt level: O0

void __thiscall
antlr::RecognitionException::RecognitionException
          (RecognitionException *this,RecognitionException *param_2)

{
  long in_RSI;
  ANTLRException *in_RDI;
  ANTLRException *in_stack_ffffffffffffffe0;
  
  ANTLRException::ANTLRException(in_stack_ffffffffffffffe0,in_RDI);
  in_RDI->_vptr_ANTLRException = (_func_int **)&PTR__RecognitionException_00562520;
  std::__cxx11::string::string((string *)(in_RDI + 1),(string *)(in_RSI + 0x28));
  *(undefined8 *)((long)&in_RDI[1].text.field_2 + 8) = *(undefined8 *)(in_RSI + 0x48);
  return;
}

Assistant:

class ANTLR_API RecognitionException : public ANTLRException
	{
	public:
		RecognitionException();
		RecognitionException(const ANTLR_USE_NAMESPACE(std)string& s);
		RecognitionException(const ANTLR_USE_NAMESPACE(std)string& s,
									const ANTLR_USE_NAMESPACE(std)string& fileName,
									int line, int column );

		virtual ~RecognitionException() throw()
		{
		}

		/// Return file where mishap occurred.
		virtual ANTLR_USE_NAMESPACE(std)string getFilename() const throw()
		{
			return fileName;
		}
		/**
		 * @return the line number that this exception happened on.
		 */
		virtual int getLine() const throw()
		{
			return line;
		}
		/**
		 * @return the column number that this exception happened on.
		 */
		virtual int getColumn() const throw()
		{
			return column;
		}

		/// Return complete error message with line/column number info (if present)
		virtual ANTLR_USE_NAMESPACE(std)string toString() const;

		/// See what file/line/column info is present and return it as a string
		virtual ANTLR_USE_NAMESPACE(std)string getFileLineColumnString() const;
	protected:
		ANTLR_USE_NAMESPACE(std)string fileName; // not used by treeparsers
		int line;    // not used by treeparsers
		int column;  // not used by treeparsers
	}